

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  bool bVar1;
  size_t sVar2;
  Fault f;
  StringPtr part_local;
  StringPtr local_30;
  StringPtr local_20;
  
  part_local.content.size_ = (size_t)part.content.ptr;
  f.exception = (Exception *)0x240547;
  part_local.content.ptr = (char *)this;
  bVar1 = StringPtr::operator!=(&part_local,(StringPtr *)&f);
  if (bVar1) {
    local_20.content.ptr = ".";
    local_20.content.size_ = 2;
    bVar1 = StringPtr::operator!=(&part_local,&local_20);
    if (bVar1) {
      local_30.content.ptr = "..";
      local_30.content.size_ = 3;
      bVar1 = StringPtr::operator!=(&part_local,&local_30);
      if (bVar1) {
        sVar2 = strlen(part_local.content.ptr);
        if (sVar2 != part_local.content.size_ - 1) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x130,FAILED,"strlen(part.begin()) == part.size()",
                     "\"NUL character in path component\", part",
                     (char (*) [32])"NUL character in path component",&part_local);
          _::Debug::Fault::fatal(&f);
        }
        StringPtr::findFirst((StringPtr *)&f,(char)&part_local);
        if ((char)f.exception != '\x01') {
          return;
        }
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68],kj::StringPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x132,FAILED,"part.findFirst(\'/\') == nullptr",
                   "\"\'/\' character in path component; did you mean to use Path::parse()?\", part"
                   ,(char (*) [68])
                    "\'/\' character in path component; did you mean to use Path::parse()?",
                   &part_local);
        _::Debug::Fault::fatal(&f);
      }
    }
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x12f,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
             "\"invalid path component\", part",(char (*) [23])"invalid path component",&part_local)
  ;
  _::Debug::Fault::fatal(&f);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == nullptr,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}